

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoncentralRelativeAdapter.cpp
# Opt level: O2

void __thiscall
opengv::relative_pose::NoncentralRelativeAdapter::NoncentralRelativeAdapter
          (NoncentralRelativeAdapter *this,bearingVectors_t *bearingVectors1,
          bearingVectors_t *bearingVectors2,camCorrespondences_t *camCorrespondences1,
          camCorrespondences_t *camCorrespondences2,translations_t *camOffsets,
          rotations_t *camRotations,rotation_t *R12)

{
  RelativeAdapterBase::RelativeAdapterBase(&this->super_RelativeAdapterBase,R12);
  (this->super_RelativeAdapterBase)._vptr_RelativeAdapterBase =
       (_func_int **)&PTR__NoncentralRelativeAdapter_003e2b48;
  this->_bearingVectors1 = bearingVectors1;
  this->_bearingVectors2 = bearingVectors2;
  this->_camCorrespondences1 = camCorrespondences1;
  this->_camCorrespondences2 = camCorrespondences2;
  this->_camOffsets = camOffsets;
  this->_camRotations = camRotations;
  return;
}

Assistant:

opengv::relative_pose::NoncentralRelativeAdapter::NoncentralRelativeAdapter(
    const bearingVectors_t & bearingVectors1,
    const bearingVectors_t & bearingVectors2,
    const camCorrespondences_t & camCorrespondences1,
    const camCorrespondences_t & camCorrespondences2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    const rotation_t & R12 ) :
    RelativeAdapterBase(R12),
    _bearingVectors1(bearingVectors1),
    _bearingVectors2(bearingVectors2),
    _camCorrespondences1(camCorrespondences1),
    _camCorrespondences2(camCorrespondences2),
    _camOffsets(camOffsets),
    _camRotations(camRotations)
{}